

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqps_unbind.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined4 extraout_EDX;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 local_d0 [2];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70 [2];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50 [2];
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (argc < 6) {
    fwrite("Usage: amqps_unbind host port exchange bindingkey queue [cacert.pem [key.pem cert.pem]]\n"
           ,0x58,1,_stderr);
    iVar5 = 1;
  }
  else {
    pcVar1 = argv[1];
    iVar5 = atoi(argv[2]);
    pcVar2 = argv[3];
    pcVar3 = argv[4];
    pcVar4 = argv[5];
    uVar8 = amqp_new_connection();
    lVar9 = amqp_ssl_socket_new(uVar8);
    if (lVar9 == 0) {
      die("creating SSL/TLS socket");
    }
    if (argc != 6) {
      iVar6 = amqp_ssl_socket_set_cacert(lVar9,argv[6]);
      if (iVar6 != 0) {
        die("setting CA certificate");
      }
      if (8 < (uint)argc) {
        iVar6 = amqp_ssl_socket_set_key(lVar9,argv[8],argv[7]);
        if (iVar6 != 0) {
          die("setting client cert");
        }
      }
    }
    iVar5 = amqp_socket_open(lVar9,pcVar1,iVar5);
    if (iVar5 != 0) {
      die("opening SSL/TLS connection");
    }
    amqp_login(local_50,uVar8,"/",0,0x20000,0,0,0x1020bd,"guest");
    x.reply.id = (int)local_50[1];
    x._0_8_ = local_50[0];
    x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
    x.reply.decoded = (void *)local_40;
    x._24_8_ = uStack_38;
    die_on_amqp_error(x,"Logging in");
    amqp_channel_open(uVar8,1);
    amqp_get_rpc_reply(local_70,uVar8);
    x_00.reply.id = (int)local_70[1];
    x_00._0_8_ = local_70[0];
    x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
    x_00.reply.decoded = (void *)local_60;
    x_00._24_8_ = uStack_58;
    die_on_amqp_error(x_00,"Opening channel");
    auVar10 = amqp_cstring_bytes(pcVar4);
    auVar11 = amqp_cstring_bytes(pcVar2);
    uVar7 = amqp_cstring_bytes(pcVar3);
    amqp_queue_unbind(uVar8,1,auVar10._0_8_,auVar10._8_8_,auVar11._0_8_,auVar11._8_8_,uVar7,
                      extraout_EDX,_amqp_empty_table,_putchar);
    amqp_get_rpc_reply(local_90,uVar8);
    x_01.reply.id = (int)local_90[1];
    x_01._0_8_ = local_90[0];
    x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
    x_01.reply.decoded = (void *)local_80;
    x_01._24_8_ = uStack_78;
    die_on_amqp_error(x_01,"Unbinding");
    amqp_channel_close(local_b0,uVar8,1,200);
    x_02.reply.id = (int)local_b0[1];
    x_02._0_8_ = local_b0[0];
    x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
    x_02.reply.decoded = (void *)local_a0;
    x_02._24_8_ = uStack_98;
    die_on_amqp_error(x_02,"Closing channel");
    amqp_connection_close(local_d0,uVar8,200);
    x_03.reply.id = (int)local_d0[1];
    x_03._0_8_ = local_d0[0];
    x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
    x_03.reply.decoded = (void *)local_c0;
    x_03._24_8_ = uStack_b8;
    die_on_amqp_error(x_03,"Closing connection");
    iVar5 = amqp_destroy_connection(uVar8);
    die_on_error(iVar5,"Ending connection");
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *bindingkey;
  char const *queue;
  amqp_socket_t *socket;
  amqp_connection_state_t conn;

  if (argc < 6) {
    fprintf(stderr, "Usage: amqps_unbind host port exchange bindingkey queue "
            "[cacert.pem [key.pem cert.pem]]\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  bindingkey = argv[4];
  queue = argv[5];

  conn = amqp_new_connection();

  socket = amqp_ssl_socket_new(conn);
  if (!socket) {
    die("creating SSL/TLS socket");
  }

  if (argc > 6) {
    status = amqp_ssl_socket_set_cacert(socket, argv[6]);
    if (status) {
      die("setting CA certificate");
    }
  }

  if (argc > 8) {
    status = amqp_ssl_socket_set_key(socket, argv[8], argv[7]);
    if (status) {
      die("setting client cert");
    }
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening SSL/TLS connection");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  amqp_queue_unbind(conn, 1,
                    amqp_cstring_bytes(queue),
                    amqp_cstring_bytes(exchange),
                    amqp_cstring_bytes(bindingkey),
                    amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Unbinding");

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");
  return 0;
}